

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O3

bool __thiscall
cmProcess::StartProcess
          (cmProcess *this,uv_loop_t *loop,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *affinity)

{
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  pointer ppcVar1;
  pointer pbVar2;
  cmCTest *pcVar3;
  pointer puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  element_type *peVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  int iVar10;
  rep rVar11;
  char *pcVar12;
  size_t sVar13;
  uv_pipe_s *puVar14;
  pointer puVar15;
  uv_stream_t *stream;
  ostream *poVar16;
  bool bVar17;
  string *arg;
  pointer pbVar18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  vector<char,_std::allocator<char>_> cpumask;
  int fds [2];
  uv_pipe_ptr pipe_writer;
  ostringstream cmCTestLog_msg;
  uv_stdio_container_t stdio [3];
  uv_handle_ptr_base_<uv_pipe_s> local_2a8;
  vector<char,_std::allocator<char>_> local_298;
  long *local_280;
  long local_270 [2];
  uv_file local_260 [2];
  uv_handle_ptr_base_<uv_pipe_s> local_258;
  uv_handle_ptr_base_<uv_timer_s> local_248;
  uv_process_options_t local_238;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1e8;
  undefined1 local_1e0 [376];
  uv_stdio_container_t local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  uv_stream_t *local_50;
  undefined8 local_48;
  uv_stream_t *local_40;
  
  this->ProcessState = Error;
  if ((this->Command)._M_string_length == 0) {
    return false;
  }
  local_1e8 = affinity;
  rVar11 = std::chrono::_V2::steady_clock::now();
  (this->StartTime).__d.__r = rVar11;
  this_00 = &this->ProcessArgs;
  ppcVar1 = (this->ProcessArgs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->ProcessArgs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar1) {
    (this->ProcessArgs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar1;
  }
  local_1e0._0_8_ = (this->Command)._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)this_00,(char **)local_1e0);
  pbVar18 = (this->Arguments).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar18 != pbVar2) {
    do {
      local_1e0._0_8_ = (pbVar18->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)this_00,(char **)local_1e0);
      pbVar18 = pbVar18 + 1;
    } while (pbVar18 != pbVar2);
  }
  local_1e0._0_8_ = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)this_00,(char **)local_1e0);
  local_248.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar10 = ::cm::uv_timer_ptr::init((uv_timer_ptr *)&local_248,(EVP_PKEY_CTX *)loop);
  if (iVar10 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,"Error initializing timer: ",0x1a);
    pcVar12 = uv_strerror(iVar10);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)&local_2a8 + (int)*(_func_int **)(local_1e0._0_8_ + -0x18) + 200);
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,pcVar12,sVar13);
    }
    std::ios::widen((char)(ostream *)local_1e0 + (char)*(_func_int **)(local_1e0._0_8_ + -0x18));
    std::ostream::put((char)local_1e0);
    std::ostream::flush();
    pcVar3 = ((this->Runner)._M_t.
              super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
              super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
              super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl)->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmProcess.cxx"
                 ,0x4a,(char *)local_238.exit_cb,false);
    if ((char ***)local_238.exit_cb != &local_238.args) {
      operator_delete(local_238.exit_cb,(long)local_238.args + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
    std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
    bVar17 = false;
    goto LAB_00259b5a;
  }
  local_258.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_258.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2a8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_2a8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)&local_258,(EVP_PKEY_CTX *)loop);
  ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)&local_2a8,(EVP_PKEY_CTX *)loop);
  local_260[0] = -1;
  local_260[1] = -1;
  iVar10 = cmGetPipes(local_260);
  if (iVar10 == 0) {
    puVar14 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                        ((uv_handle_ptr_<uv_pipe_s> *)&local_2a8);
    uv_pipe_open(puVar14,local_260[0]);
    puVar14 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                        ((uv_handle_ptr_<uv_pipe_s> *)&local_258);
    uv_pipe_open(puVar14,local_260[1]);
    local_68.flags = UV_INHERIT_FD;
    local_68.data.fd = 0;
    local_58 = 4;
    local_50 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)&local_258);
    pvVar9 = local_1e8;
    local_48 = CONCAT44(uStack_54,local_58);
    local_238.cpumask_size = 0;
    local_238.uid = 0;
    local_238.gid = 0;
    local_238.cpumask = (char *)0x0;
    local_238.env = (char **)0x0;
    local_238.cwd = (char *)0x0;
    local_238.file = (this->Command)._M_dataplus._M_p;
    local_238.args =
         (this->ProcessArgs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
         .super__Vector_impl_data._M_start;
    local_238.flags = 0;
    local_238.stdio_count = 3;
    local_238.exit_cb = OnExitCB;
    local_238.stdio = &local_68;
    local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_40 = local_50;
    if ((local_1e8 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) ||
       ((local_1e8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (local_1e8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish)) {
      local_238.cpumask = (pointer)0x0;
      local_238.cpumask_size = 0;
    }
    else {
      iVar10 = uv_cpumask_size();
      local_1e0._0_8_ = local_1e0._0_8_ & 0xffffffffffffff00;
      std::vector<char,_std::allocator<char>_>::resize(&local_298,(long)iVar10,local_1e0);
      puVar4 = (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar15 = (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start; puVar15 != puVar4;
          puVar15 = puVar15 + 1) {
        local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[*puVar15] = '\x01';
      }
      local_238.cpumask =
           local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start;
      local_238.cpumask_size =
           (long)local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
    }
    local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = local_238.cpumask;
    stream = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)&local_2a8);
    iVar10 = uv_read_start(stream,OnAllocateCB,OnReadCB);
    if (iVar10 == 0) {
      iVar10 = ::cm::uv_process_ptr::spawn(&this->Process,loop,&local_238,this);
      _Var7._M_pi = local_2a8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar6 = local_2a8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (iVar10 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e0,"Process not started\n ",0x15);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e0,(this->Command)._M_dataplus._M_p,
                             (this->Command)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n[",2);
        pcVar12 = uv_strerror(iVar10);
        poVar16 = std::operator<<(poVar16,pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"]\n",2);
        pcVar3 = ((this->Runner)._M_t.
                  super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
                  super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
                  super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl)->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmProcess.cxx"
                     ,0x8c,(char *)local_280,false);
        goto LAB_00259af3;
      }
      local_2a8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_2a8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var5 = (this->PipeReader).super_uv_handle_ptr_<uv_pipe_s>.
               super_uv_handle_ptr_base_<uv_pipe_s>.handle.
               super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->PipeReader).super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle
      .super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
      (this->PipeReader).super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle
      .super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      _Var7._M_pi = local_248.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar8 = local_248.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_248.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_248.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var5 = (this->Timer).super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.
               handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->Timer).super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
      super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar8;
      (this->Timer).super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
      super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if ((this->Timeout).
          super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>.
          _M_engaged == true) {
        ::cm::uv_timer_ptr::start
                  (&this->Timer,OnTimeoutCB,
                   (long)((double)(this->Timeout).
                                  super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>
                                  ._M_payload.
                                  super__Optional_payload_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>
                                  ._M_payload * 1000.0),0);
      }
      this->ProcessState = Executing;
      bVar17 = true;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e0,"Error starting read events: ",0x1c);
      pcVar12 = uv_strerror(iVar10);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)&local_2a8 + (int)*(_func_int **)(local_1e0._0_8_ + -0x18) + 200);
      }
      else {
        sVar13 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,pcVar12,sVar13);
      }
      std::ios::widen((char)(ostream *)local_1e0 + (char)*(_func_int **)(local_1e0._0_8_ + -0x18));
      std::ostream::put((char)local_1e0);
      std::ostream::flush();
      pcVar3 = ((this->Runner)._M_t.
                super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
                super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
                super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl)->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmProcess.cxx"
                   ,0x84,(char *)local_280,false);
LAB_00259af3:
      if (local_280 != local_270) {
        operator_delete(local_280,local_270[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
      bVar17 = false;
    }
    if (local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e0,"Error initializing pipe: ",0x19);
    pcVar12 = uv_strerror(iVar10);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)&local_2a8 + (int)*(_func_int **)(local_1e0._0_8_ + -0x18) + 200);
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,pcVar12,sVar13);
    }
    std::ios::widen((char)(ostream *)local_1e0 + (char)*(_func_int **)(local_1e0._0_8_ + -0x18));
    std::ostream::put((char)local_1e0);
    std::ostream::flush();
    pcVar3 = ((this->Runner)._M_t.
              super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
              super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
              super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl)->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmProcess.cxx"
                 ,0x59,(char *)local_238.exit_cb,false);
    if ((char ***)local_238.exit_cb != &local_238.args) {
      operator_delete(local_238.exit_cb,(long)local_238.args + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
    std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
    bVar17 = false;
  }
  ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_2a8);
  ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_258);
LAB_00259b5a:
  ::cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_(&local_248);
  return bVar17;
}

Assistant:

bool cmProcess::StartProcess(uv_loop_t& loop, std::vector<size_t>* affinity)
{
  this->ProcessState = cmProcess::State::Error;
  if (this->Command.empty()) {
    return false;
  }
  this->StartTime = std::chrono::steady_clock::now();
  this->ProcessArgs.clear();
  // put the command as arg0
  this->ProcessArgs.push_back(this->Command.c_str());
  // now put the command arguments in
  for (std::string const& arg : this->Arguments) {
    this->ProcessArgs.push_back(arg.c_str());
  }
  this->ProcessArgs.push_back(nullptr); // null terminate the list

  cm::uv_timer_ptr timer;
  int status = timer.init(loop, this);
  if (status != 0) {
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Error initializing timer: " << uv_strerror(status)
                                            << std::endl);
    return false;
  }

  cm::uv_pipe_ptr pipe_writer;
  cm::uv_pipe_ptr pipe_reader;

  pipe_writer.init(loop, 0);
  pipe_reader.init(loop, 0, this);

  int fds[2] = { -1, -1 };
  status = cmGetPipes(fds);
  if (status != 0) {
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Error initializing pipe: " << uv_strerror(status)
                                           << std::endl);
    return false;
  }

  uv_pipe_open(pipe_reader, fds[0]);
  uv_pipe_open(pipe_writer, fds[1]);

  uv_stdio_container_t stdio[3];
  stdio[0].flags = UV_INHERIT_FD;
  stdio[0].data.fd = 0;
  stdio[1].flags = UV_INHERIT_STREAM;
  stdio[1].data.stream = pipe_writer;
  stdio[2] = stdio[1];

  uv_process_options_t options = uv_process_options_t();
  options.file = this->Command.data();
  options.args = const_cast<char**>(this->ProcessArgs.data());
  options.stdio_count = 3; // in, out and err
  options.exit_cb = &cmProcess::OnExitCB;
  options.stdio = stdio;
#if !defined(CMAKE_USE_SYSTEM_LIBUV)
  std::vector<char> cpumask;
  if (affinity && !affinity->empty()) {
    cpumask.resize(static_cast<size_t>(uv_cpumask_size()), 0);
    for (auto p : *affinity) {
      cpumask[p] = 1;
    }
    options.cpumask = cpumask.data();
    options.cpumask_size = cpumask.size();
  } else {
    options.cpumask = nullptr;
    options.cpumask_size = 0;
  }
#else
  static_cast<void>(affinity);
#endif

  status =
    uv_read_start(pipe_reader, &cmProcess::OnAllocateCB, &cmProcess::OnReadCB);

  if (status != 0) {
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Error starting read events: " << uv_strerror(status)
                                              << std::endl);
    return false;
  }

  status = this->Process.spawn(loop, options, this);
  if (status != 0) {
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Process not started\n " << this->Command << "\n["
                                        << uv_strerror(status) << "]\n");
    return false;
  }

  this->PipeReader = std::move(pipe_reader);
  this->Timer = std::move(timer);

  this->StartTimer();

  this->ProcessState = cmProcess::State::Executing;
  return true;
}